

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * soul::Value::fromExternalValue(soul::Type_const&,choc::value::ValueView_const&,soul::
        ConstantTable&,soul::StringDictionary&)::ConversionState::castOrThrow(soul::Type_const&,soul
        ::Value___(Value *__return_storage_ptr__,Type *type,Value *v)

{
  bool bVar1;
  Type *this;
  CompileMessage local_a8;
  undefined1 local_59;
  undefined1 local_58 [8];
  CompileMessage errorMessage;
  Value *v_local;
  Type *type_local;
  Value *result;
  
  errorMessage._48_8_ = v;
  this = getType(v);
  bVar1 = Type::isIdentical(this,type);
  if (bVar1) {
    Value::Value(__return_storage_ptr__,(Value *)errorMessage._48_8_);
  }
  else {
    CompileMessage::CompileMessage((CompileMessage *)local_58);
    local_59 = 0;
    tryCastToType(__return_storage_ptr__,(Value *)errorMessage._48_8_,type,
                  (CompileMessage *)local_58);
    bVar1 = isValid(__return_storage_ptr__);
    if (!bVar1) {
      CompileMessage::CompileMessage(&local_a8,(CompileMessage *)local_58);
      throwError(&local_a8);
    }
    local_59 = 1;
    CompileMessage::~CompileMessage((CompileMessage *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

static Value castOrThrow (const Type& type, Value&& v)
        {
            if (v.getType().isIdentical (type))
                return std::move (v);

            CompileMessage errorMessage;
            auto result = v.tryCastToType (type, errorMessage);

            if (! result.isValid())
                throwError (errorMessage);

            return result;
        }